

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.cpp
# Opt level: O0

AABox * operator+(AABox *a,AABox *b)

{
  double dVar1;
  double dVar2;
  float *in_RDX;
  float *in_RSI;
  AABox *in_RDI;
  double dVar3;
  AABox *t;
  
  AABox::AABox(in_RDI);
  dVar3 = (double)*in_RSI;
  dVar1 = (double)*in_RDX;
  dVar2 = dVar1;
  if (dVar3 <= dVar1) {
    dVar2 = dVar3;
  }
  in_RDI->x1 = (float)(double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                              -(ulong)NAN(dVar3) & (ulong)dVar1);
  dVar3 = (double)in_RSI[1];
  dVar1 = (double)in_RDX[1];
  dVar2 = dVar1;
  if (dVar1 <= dVar3) {
    dVar2 = dVar3;
  }
  in_RDI->x2 = (float)(double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                              -(ulong)NAN(dVar3) & (ulong)dVar1);
  dVar3 = (double)in_RSI[2];
  dVar1 = (double)in_RDX[2];
  dVar2 = dVar1;
  if (dVar3 <= dVar1) {
    dVar2 = dVar3;
  }
  in_RDI->y1 = (float)(double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                              -(ulong)NAN(dVar3) & (ulong)dVar1);
  dVar3 = (double)in_RSI[3];
  dVar1 = (double)in_RDX[3];
  dVar2 = dVar1;
  if (dVar1 <= dVar3) {
    dVar2 = dVar3;
  }
  in_RDI->y2 = (float)(double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                              -(ulong)NAN(dVar3) & (ulong)dVar1);
  dVar3 = (double)in_RSI[4];
  dVar1 = (double)in_RDX[4];
  dVar2 = dVar1;
  if (dVar3 <= dVar1) {
    dVar2 = dVar3;
  }
  in_RDI->z1 = (float)(double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                              -(ulong)NAN(dVar3) & (ulong)dVar1);
  dVar3 = (double)in_RSI[5];
  dVar1 = (double)in_RDX[5];
  dVar2 = dVar1;
  if (dVar1 <= dVar3) {
    dVar2 = dVar3;
  }
  in_RDI->z2 = (float)(double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 |
                              -(ulong)NAN(dVar3) & (ulong)dVar1);
  return in_RDI;
}

Assistant:

AABox operator+ (const AABox& a, const AABox& b) {
	AABox t;
	t.x1 = fmin(a.x1, b.x1);
	t.x2 = fmax(a.x2, b.x2);
	t.y1 = fmin(a.y1, b.y1);
	t.y2 = fmax(a.y2, b.y2);
	t.z1 = fmin(a.z1, b.z1);
	t.z2 = fmax(a.z2, b.z2);
	return t;
}